

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O0

void Sbc_ManDelayTrace(Gia_Man_t *p)

{
  Vec_Bit_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj;
  int *piVar4;
  bool local_65;
  int local_40;
  uint local_3c;
  int nEdgesAll;
  int nEdges;
  int nNodes;
  int nLuts;
  int *pLevels;
  int nLevels;
  int iFan;
  int k;
  int i;
  Vec_Bit_t *vPath;
  Gia_Man_t *p_local;
  
  vPath = (Vec_Bit_t *)p;
  iVar1 = Gia_ManObjNum(p);
  _k = Vec_BitStart(iVar1);
  nEdges = 0;
  nEdgesAll = 0;
  local_3c = 0;
  local_40 = 0;
  iVar1 = Gia_ManHasMapping((Gia_Man_t *)vPath);
  if (iVar1 == 0) {
    printf("No mapping is available.\n");
  }
  else {
    iVar1 = Gia_ManHasMapping((Gia_Man_t *)vPath);
    if (iVar1 == 0) {
      __assert_fail("Gia_ManHasMapping(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdPath.c"
                    ,0x9e,"void Sbc_ManDelayTrace(Gia_Man_t *)");
    }
    pLevels._0_4_ = Gia_ManLutLevel((Gia_Man_t *)vPath,(int **)&nNodes);
    for (iFan = 0; iVar1 = iFan, iVar2 = Vec_IntSize((Vec_Int_t *)vPath[4].pArray), p_00 = vPath,
        iVar1 < iVar2; iFan = iFan + 1) {
      pObj = Gia_ManCo((Gia_Man_t *)vPath,iFan);
      pLevels._4_4_ = Gia_ObjFaninId0p((Gia_Man_t *)p_00,pObj);
      if (_nNodes[pLevels._4_4_] == (uint)pLevels) {
        Vec_BitWriteEntry(_k,pLevels._4_4_,1);
      }
    }
    iFan = Gia_ManObjNum((Gia_Man_t *)vPath);
    while (iFan = iFan + -1, 0 < iFan) {
      iVar1 = Gia_ObjIsLut((Gia_Man_t *)vPath,iFan);
      if (iVar1 != 0) {
        nEdges = nEdges + 1;
        iVar1 = Vec_BitEntry(_k,iFan);
        if (iVar1 != 0) {
          nEdgesAll = nEdgesAll + 1;
          for (nLevels = 0; iVar1 = nLevels, iVar2 = Gia_ObjLutSize((Gia_Man_t *)vPath,iFan),
              iVar1 < iVar2; nLevels = nLevels + 1) {
            piVar4 = Gia_ObjLutFanins((Gia_Man_t *)vPath,iFan);
            pLevels._4_4_ = piVar4[nLevels];
            if (_nNodes[iFan] <= _nNodes[pLevels._4_4_] + 1) {
              if (_nNodes[pLevels._4_4_] + 1 != _nNodes[iFan]) {
                __assert_fail("pLevels[iFan] + 1 == pLevels[i]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdPath.c"
                              ,0xaf,"void Sbc_ManDelayTrace(Gia_Man_t *)");
              }
              Vec_BitWriteEntry(_k,pLevels._4_4_,1);
              local_3c = local_3c + 1;
            }
          }
        }
      }
    }
    for (iFan = 1; iVar1 = iFan, iVar2 = Gia_ManObjNum((Gia_Man_t *)vPath), iVar1 < iVar2;
        iFan = iFan + 1) {
      iVar1 = Gia_ObjIsLut((Gia_Man_t *)vPath,iFan);
      if (iVar1 != 0) {
        for (nLevels = 0; iVar1 = nLevels, iVar2 = Gia_ObjLutSize((Gia_Man_t *)vPath,iFan),
            iVar1 < iVar2; nLevels = nLevels + 1) {
          piVar4 = Gia_ObjLutFanins((Gia_Man_t *)vPath,iFan);
          pLevels._4_4_ = piVar4[nLevels];
          iVar1 = Vec_BitEntry(_k,iFan);
          local_65 = false;
          if (iVar1 != 0) {
            iVar1 = Vec_BitEntry(_k,pLevels._4_4_);
            local_65 = iVar1 != 0;
          }
          local_40 = (uint)local_65 + local_40;
        }
      }
    }
    if (_nNodes != (int *)0x0) {
      free(_nNodes);
      _nNodes = (int *)0x0;
    }
    Vec_BitFree(_k);
    uVar3 = Gia_ManAndNum((Gia_Man_t *)vPath);
    printf("AIG = %d. LUT = %d. Lev = %d.   Path nodes = %d.  Path edges = %d. (%d.)\n",(ulong)uVar3
           ,(ulong)(uint)nEdges,(ulong)(uint)pLevels,(ulong)(uint)nEdgesAll,(ulong)local_3c,local_40
          );
  }
  return;
}

Assistant:

void Sbc_ManDelayTrace( Gia_Man_t * p )
{
    Vec_Bit_t * vPath = Vec_BitStart( Gia_ManObjNum(p) );
    int i, k, iFan, nLevels, * pLevels;
    int nLuts = 0, nNodes = 0, nEdges = 0, nEdgesAll = 0;
    if ( !Gia_ManHasMapping(p) )
    {
        printf( "No mapping is available.\n" );
        return;
    }
    assert( Gia_ManHasMapping(p) );
    // set critical CO drivers
    nLevels = Gia_ManLutLevel( p, &pLevels );
    Gia_ManForEachCoDriverId( p, iFan, i )
        if ( pLevels[iFan] == nLevels )
            Vec_BitWriteEntry( vPath, iFan, 1 );
    // set critical internal nodes
    Gia_ManForEachLutReverse( p, i )
    { 
        nLuts++;
        if ( !Vec_BitEntry(vPath, i) )
            continue;
        nNodes++;
        Gia_LutForEachFanin( p, i, iFan, k )
        {
            if ( pLevels[iFan] +1 < pLevels[i] )
                continue;
            assert( pLevels[iFan] + 1 == pLevels[i] );
            Vec_BitWriteEntry( vPath, iFan, 1 );
            nEdges++;
            //printf( "%d -> %d\n", i, iFan );
        }
    }
    Gia_ManForEachLut( p, i )
        Gia_LutForEachFanin( p, i, iFan, k )
            nEdgesAll += (Vec_BitEntry(vPath, i) && Vec_BitEntry(vPath, iFan));

    ABC_FREE( pLevels );
    Vec_BitFree( vPath );
    printf( "AIG = %d. LUT = %d. Lev = %d.   Path nodes = %d.  Path edges = %d. (%d.)\n", 
        Gia_ManAndNum(p), nLuts, nLevels, nNodes, nEdges, nEdgesAll );
}